

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O3

double extract_spR<PredictionData<float,long>,long>
                 (PredictionData<float,_long> *prediction_data,long *row_st,long *row_end,
                 size_t col_num)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  dVar4 = 0.0;
  if ((long)row_end - (long)row_st != 0) {
    uVar1 = (long)row_end - (long)row_st >> 3;
    while (0 < (long)uVar1) {
      uVar2 = uVar1 >> 1;
      uVar3 = ~uVar2 + uVar1;
      uVar1 = uVar2;
      if ((long)((size_t *)row_st)[uVar2] < (long)col_num) {
        uVar1 = uVar3;
        row_st = (long *)((size_t *)row_st + uVar2 + 1);
      }
    }
    if ((row_st != row_end) && (*row_st == col_num)) {
      dVar4 = (double)*(float *)((long)prediction_data->Xr +
                                ((long)row_st - (long)prediction_data->Xr_ind >> 1));
    }
  }
  return dVar4;
}

Assistant:

double extract_spR(const PredictionData &prediction_data, const sparse_ix *row_st, const sparse_ix *row_end, size_t col_num) noexcept
{
    if (row_end == row_st)
        return 0.;
    const sparse_ix *search_res = std::lower_bound(row_st, row_end, (sparse_ix) col_num);
    if (search_res == row_end || *search_res != (sparse_ix)col_num)
        return 0.;
    else
        return prediction_data.Xr[search_res - prediction_data.Xr_ind];
}